

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void MultiplicationHelper<unsigned_short,_unsigned_long,_8>::
     MultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
               (unsigned_short *t,unsigned_long *u,unsigned_short *ret)

{
  uint64_t *in_RDX;
  undefined8 *in_RSI;
  uint32_t tmp;
  uint64_t u1;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar1;
  uint32_t *pRet;
  
  pRet = (uint32_t *)*in_RSI;
  uVar1 = 0;
  LargeIntRegMultiply<unsigned_int,_unsigned_long>::
  RegMultiplyThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((uint32_t)((ulong)in_RSI >> 0x20),in_RDX,pRet);
  SafeCastHelper<unsigned_short,_unsigned_int,_2>::
  CastThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
            ((uint)((ulong)pRet >> 0x20),(unsigned_short *)CONCAT44(uVar1,in_stack_ffffffffffffffd8)
            );
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void MultiplyThrow(const T& t, const U& u, T& ret) SAFEINT_CPP_THROW
    {
        static_assert(safeint_internal::int_traits<U>::isUint64, "U must be Uint64");
        std::uint64_t u1 = u;
        std::uint32_t tmp = 0;

        LargeIntRegMultiply< std::uint32_t, std::uint64_t >::template RegMultiplyThrow< E >( t, u1, &tmp );
        SafeCastHelper< T, std::uint32_t, GetCastMethod< T, std::uint32_t >::method >::template CastThrow< E >(tmp, ret);
    }